

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicDispatchIndirect::CheckBinding
          (BasicDispatchIndirect *this,GLuint expected)

{
  GLboolean local_2d;
  GLfloat expectedFloat;
  GLuint GStack_28;
  GLboolean b;
  GLfloat f;
  GLint64 i64;
  GLint i;
  GLuint expected_local;
  BasicDispatchIndirect *this_local;
  
  i64._4_4_ = expected;
  _i = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90ef,(GLint *)&i64);
  if ((GLuint)i64 == i64._4_4_) {
    glu::CallLogWrapper::glGetInteger64v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90ef,(GLint64 *)&stack0xffffffffffffffd8);
    if (GStack_28 == i64._4_4_) {
      glu::CallLogWrapper::glGetFloatv
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ef,&expectedFloat);
      if ((expectedFloat != (float)expected) || (NAN(expectedFloat) || NAN((float)expected))) {
        this_local._7_1_ = false;
      }
      else {
        glu::CallLogWrapper::glGetBooleanv
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90ef,&local_2d);
        if ((bool)local_2d == (i64._4_4_ != 0)) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CheckBinding(GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLboolean b;

		GLfloat expectedFloat = static_cast<GLfloat>(expected);

		glGetIntegerv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i);
		if (static_cast<GLuint>(i) != expected)
		{
			return false;
		}
		glGetInteger64v(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &i64);
		if (static_cast<GLuint>(i64) != expected)
		{
			return false;
		}
		glGetFloatv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &f);
		if (f != expectedFloat)
		{
			return false;
		}
		glGetBooleanv(GL_DISPATCH_INDIRECT_BUFFER_BINDING, &b);
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
		{
			return false;
		}

		return true;
	}